

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_NtkCreateFan(Au_Ntk_t *pNtk,int iFanin,int iFanout,int iModel)

{
  uint uVar1;
  Au_Obj_t *p;
  
  uVar1 = Au_NtkAllocObj(pNtk,1,4);
  p = (Au_Obj_t *)((ulong)((uVar1 & 0xfff) << 4) + (long)(pNtk->vPages).pArray[(int)uVar1 >> 0xc]);
  if (iFanin != 0) {
    Au_ObjSetFaninLit(p,0,iFanin);
  }
  Au_ObjSetFaninLit(p,1,iFanout);
  *(ulong *)p = *(ulong *)p & 0xffffffffc0000000 | (ulong)(iModel & 0x3fffffff);
  return uVar1;
}

Assistant:

int Au_NtkCreateFan( Au_Ntk_t * pNtk, int iFanin, int iFanout, int iModel )
{
    int Id = Au_NtkAllocObj( pNtk, 1, AU_OBJ_FAN );
    Au_Obj_t * p = Au_NtkObj( pNtk, Id );
    if ( iFanin )
        Au_ObjSetFaninLit( p, 0, iFanin );
    Au_ObjSetFaninLit( p, 1, iFanout );
    p->Func = iModel;
    return Id;
}